

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O2

list<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
StackTrace::return_stack_trace_abi_cxx11_
          (list<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          StackTrace *this,size_t address)

{
  const_iterator cVar1;
  pair<unsigned_long,_unsigned_long> data;
  size_t local_40;
  pair<unsigned_long,_unsigned_long> local_38;
  
  local_40 = address;
  ipc::spinlock::lock(&this->lock);
  cVar1 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                      *)this,&local_40);
  if (cVar1.inner_.ctrl_ ==
      (this->_read_write).
      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
      .
      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
      .ctrl_ + (this->_read_write).
               super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               .
               super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               .capacity_) {
    (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl._M_node._M_size = 0;
  }
  else {
    local_38.first = *(unsigned_long *)((long)cVar1.inner_.field_1.slot_ + 8);
    local_38.second = *(unsigned_long *)((long)cVar1.inner_.field_1.slot_ + 0x10);
    make_trace_abi_cxx11_(__return_storage_ptr__,this,&local_38);
  }
  (this->lock)._locked._M_base._M_i = false;
  return __return_storage_ptr__;
}

Assistant:

std::list<size_t> StackTrace::return_stack_trace(size_t address) const {
  std::lock_guard<ipc::spinlock> lg(lock);
  auto it = _read_write.find(address);
  if (it != _read_write.end()) {
    auto data = it->second;
    return make_trace(data);
  }
  // A read/write operation was not tracked correctly -> return empty stack
  // trace
  return {};
}